

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

string * __thiscall
Catch::Matchers::WithinUlpsMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinUlpsMatcher *this)

{
  ostream *poVar1;
  float fVar2;
  double dVar3;
  stringstream ret;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ret);
  poVar1 = std::operator<<(local_190,"is within ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," ULPs of ");
  if (this->m_type == Float) {
    anon_unknown_23::write<float>(local_190,(float)this->m_target);
    std::operator<<(local_190,'f');
  }
  else {
    anon_unknown_23::write<double>(local_190,this->m_target);
  }
  std::operator<<(local_190," ([");
  if (this->m_type == Double) {
    dVar3 = anon_unknown_23::step<double>(this->m_target,-INFINITY,this->m_ulps);
    anon_unknown_23::write<double>(local_190,dVar3);
    std::operator<<(local_190,", ");
    dVar3 = anon_unknown_23::step<double>(this->m_target,INFINITY,this->m_ulps);
    anon_unknown_23::write<double>(local_190,dVar3);
  }
  else {
    fVar2 = anon_unknown_23::step<float>((float)this->m_target,-INFINITY,this->m_ulps);
    anon_unknown_23::write<float>(local_190,fVar2);
    std::operator<<(local_190,", ");
    fVar2 = anon_unknown_23::step<float>((float)this->m_target,INFINITY,this->m_ulps);
    anon_unknown_23::write<float>(local_190,fVar2);
  }
  std::operator<<(local_190,"])");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ret);
  return __return_storage_ptr__;
}

Assistant:

std::string WithinUlpsMatcher::describe() const {
            std::stringstream ret;

            ret << "is within " << m_ulps << " ULPs of ";

            if (m_type == Detail::FloatingPointKind::Float) {
                write(ret, static_cast<float>(m_target));
                ret << 'f';
            }
            else {
                write(ret, m_target);
            }

            ret << " ([";
            if (m_type == Detail::FloatingPointKind::Double) {
                write(ret, step(m_target, static_cast<double>(-INFINITY), m_ulps));
                ret << ", ";
                write(ret, step(m_target, static_cast<double>(INFINITY), m_ulps));
            }
            else {
                // We have to cast INFINITY to float because of MinGW, see #1782
                write(ret, step(static_cast<float>(m_target), static_cast<float>(-INFINITY), m_ulps));
                ret << ", ";
                write(ret, step(static_cast<float>(m_target), static_cast<float>(INFINITY), m_ulps));
            }
            ret << "])";

            return ret.str();
        }